

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetBXSingleStray(ndicapi *pol,int portHandle,float *outCoord)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar1 = pol->BxHandleCount;
  if (bVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (pol->BxHandles[uVar2] == portHandle) break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)bVar1;
    } while (bVar1 != uVar2);
  }
  bVar4 = (uint)uVar3 == (uint)bVar1;
  if (!bVar4) {
    outCoord[2] = pol->BxActiveSingleStrayMarkerPosition[uVar3 & 0xffffffff][2];
    *(undefined8 *)outCoord =
         *(undefined8 *)pol->BxActiveSingleStrayMarkerPosition[uVar3 & 0xffffffff];
  }
  return (uint)bVar4;
}

Assistant:

ndicapiExport int ndiGetBXSingleStray(ndicapi* pol, int portHandle, float outCoord[3])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(outCoord, pol->BxActiveSingleStrayMarkerPosition[i], sizeof(float) * 3);
  return NDI_OKAY;
}